

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O1

void __thiscall despot::MemoryPool<despot::TagState>::DeleteAll(MemoryPool<despot::TagState> *this)

{
  Chunk *pCVar1;
  pointer ppTVar2;
  pointer ppCVar3;
  long lVar4;
  pointer ppCVar5;
  
  ppCVar3 = (this->chunks_).
            super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar5 = (this->chunks_).
                 super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar5 != ppCVar3;
      ppCVar5 = ppCVar5 + 1) {
    pCVar1 = *ppCVar5;
    if (pCVar1 != (Chunk *)0x0) {
      lVar4 = 0x1fe0;
      do {
        despot::State::~State(&pCVar1->Objects[0].super_State + lVar4);
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != -0x20);
      operator_delete(pCVar1,0x2000);
    }
    ppCVar3 = (this->chunks_).
              super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  ppCVar5 = (this->chunks_).
            super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar3 != ppCVar5) {
    (this->chunks_).
    super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppCVar5;
  }
  ppTVar2 = (this->freelist_).
            super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->freelist_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppTVar2) {
    (this->freelist_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppTVar2;
  }
  this->num_allocated_ = 0;
  return;
}

Assistant:

void DeleteAll() {
		for (chunk_iterator_ i_chunk = chunks_.begin();
			i_chunk != chunks_.end(); ++i_chunk)
			delete *i_chunk;
		chunks_.clear();
		freelist_.clear();
		num_allocated_ = 0;
	}